

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O3

void load_cfg(char *filename,deque<Section_*,_std::allocator<Section_*>_> *dnet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Section *pSVar2;
  char cVar3;
  long lVar4;
  mapped_type *pmVar5;
  undefined8 extraout_RAX;
  int iVar6;
  Section *section;
  string key;
  string value;
  string line;
  ifstream icfg;
  undefined1 auStack_2f8 [8];
  Section *local_2f0;
  int local_2e4;
  string local_2e0;
  deque<Section*,std::allocator<Section*>> *local_2c0;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  paVar1 = &local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_2c0 = (deque<Section*,std::allocator<Section*>> *)dnet;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    load_cfg();
    std::ifstream::~ifstream(local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    _Unwind_Resume(extraout_RAX);
  }
  local_2f0 = (Section *)0x0;
  lVar4 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar4] & 2) == 0) {
    iVar6 = 0;
    local_2e4 = 0;
    do {
      while( true ) {
        iVar6 = iVar6 + 1;
        cVar3 = std::ios::widen((char)auStack_2f8 + (char)lVar4 + -0x40);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_258,cVar3);
        trim(&local_258);
        if ((local_258._M_string_length != 0) && (*local_258._M_dataplus._M_p != '#')) break;
        lVar4 = *(long *)(local_238[0] + -0x18);
        if ((abStack_218[lVar4] & 2) != 0) goto LAB_00106102;
      }
      if ((*local_258._M_dataplus._M_p == '[') &&
         (local_258._M_dataplus._M_p[local_258._M_string_length - 1] == ']')) {
        std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&local_258);
        std::__cxx11::string::operator=((string *)&local_258,(string *)&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        local_2f0 = (Section *)operator_new(0x240);
        (local_2f0->name)._M_dataplus._M_p = (pointer)&(local_2f0->name).field_2;
        (local_2f0->name)._M_string_length = 0;
        (local_2f0->name).field_2._M_local_buf[0] = '\0';
        local_2f0->line_number = -1;
        (local_2f0->options)._M_h._M_buckets = &(local_2f0->options)._M_h._M_single_bucket;
        (local_2f0->options)._M_h._M_bucket_count = 1;
        (local_2f0->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (local_2f0->options)._M_h._M_element_count = 0;
        (local_2f0->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (local_2f0->options)._M_h._M_rehash_policy._M_next_resize = 0;
        (local_2f0->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_2f0->w = 0x1a0;
        local_2f0->h = 0x1a0;
        local_2f0->c = 3;
        local_2f0->inputs = 0x100;
        local_2f0->letter_box = 0;
        local_2f0->batch_normalize = 0;
        local_2f0->filters = 1;
        local_2f0->size = 1;
        local_2f0->groups = 1;
        local_2f0->stride = 1;
        local_2f0->padding = -1;
        local_2f0->pad = 0;
        local_2f0->dilation = 1;
        (local_2f0->activation)._M_dataplus._M_p = (pointer)&(local_2f0->activation).field_2;
        (local_2f0->activation)._M_string_length = 0;
        (local_2f0->activation).field_2._M_local_buf[0] = '\0';
        (local_2f0->layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->anchors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->anchors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->anchors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2f0->group_id = -1;
        local_2f0->classes = 0;
        local_2f0->num = 0;
        local_2f0->ignore_thresh = 0.45;
        local_2f0->scale_x_y = 1.0;
        (local_2f0->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->rolling_mean).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->rolling_mean).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->rolling_mean).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->rolling_variance).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->rolling_variance).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->rolling_variance).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->layer_type)._M_dataplus._M_p = (pointer)&(local_2f0->layer_type).field_2;
        (local_2f0->layer_type)._M_string_length = 0;
        (local_2f0->layer_type).field_2._M_local_buf[0] = '\0';
        (local_2f0->layer_name)._M_dataplus._M_p = (pointer)&(local_2f0->layer_name).field_2;
        (local_2f0->layer_name)._M_string_length = 0;
        (local_2f0->layer_name).field_2._M_local_buf[0] = '\0';
        (local_2f0->input_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->input_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->input_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->real_output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->real_output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->real_output_blobs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->param).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->param).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->param).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)local_2f0);
        local_2f0->line_number = iVar6;
        local_2f0->original_layer_count = local_2e4;
        local_2e4 = local_2e4 + 1;
        if (*(undefined8 **)(local_2c0 + 0x30) == (undefined8 *)(*(long *)(local_2c0 + 0x40) + -8))
        {
          std::deque<Section*,std::allocator<Section*>>::_M_push_back_aux<Section*const&>
                    (local_2c0,&local_2f0);
        }
        else {
          **(undefined8 **)(local_2c0 + 0x30) = local_2f0;
          *(long *)(local_2c0 + 0x30) = *(long *)(local_2c0 + 0x30) + 8;
        }
      }
      else {
        lVar4 = std::__cxx11::string::find((char)&local_258,0x3d);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)&local_2e0,(ulong)&local_258);
          std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_258);
          trim(&local_298);
          pSVar2 = local_2f0;
          trim(&local_2e0);
          pmVar5 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&pSVar2->options,&local_2e0);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          pSVar2 = local_2f0;
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_298._M_dataplus._M_p,
                     local_298._M_dataplus._M_p + local_298._M_string_length);
          update_field(pSVar2,&local_2b8,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
        }
      }
      lVar4 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar4] & 2) == 0);
  }
LAB_00106102:
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return;
}

Assistant:

void load_cfg(const char* filename, std::deque<Section*>& dnet)
{
    std::string line;
    std::ifstream icfg(filename, std::ifstream::in);
    if (!icfg.good())
    {
        fprintf(stderr, "Couldn't cfg open file: %s\n", filename);
        exit(EXIT_FAILURE);
    }

    Section* section = NULL;
    size_t pos;
    int section_count = 0, line_count = 0;
    while (!icfg.eof())
    {
        line_count++;
        std::getline(icfg, line);
        trim(line);
        if (line.length() == 0 || line.at(0) == '#')
            continue;
        if (line.at(0) == '[' && line.at(line.length() - 1) == ']')
        {
            line = line.substr(1, line.length() - 2);
            section = new Section;
            section->name = line;
            section->line_number = line_count;
            section->original_layer_count = section_count++;
            dnet.push_back(section);
        }
        else if ((pos = line.find_first_of('=')) != std::string::npos)
        {
            std::string key = line.substr(0, pos);
            std::string value = line.substr(pos + 1, line.length() - 1);
            section->options[trim(key)] = trim(value);
            update_field(section, key, value);
        }
    }

    icfg.close();
}